

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::curiosity::Curiosity::GetWheelAppliedTorque
          (ChVector<double> *__return_storage_ptr__,Curiosity *this,CuriosityWheelID id)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(((this->m_wheels)._M_elems[id].
                      super___shared_ptr<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_CuriosityPart).m_body.
                    super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2> + 8))->
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  chrono::ChBody::GetAppliedTorque();
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

ChVector<> Curiosity::GetWheelAppliedTorque(CuriosityWheelID id) const {
    return m_wheels[id]->GetBody()->GetAppliedTorque();
}